

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_valence_decoder.h
# Opt level: O0

uint32_t __thiscall
draco::MeshEdgebreakerTraversalValenceDecoder::DecodeSymbol
          (MeshEdgebreakerTraversalValenceDecoder *this)

{
  uint16_t uVar1;
  int iVar2;
  uint32_t uVar3;
  reference pvVar4;
  reference this_00;
  reference pvVar5;
  long in_RDI;
  uint32_t symbol_id;
  int context_counter;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  if (*(int *)(in_RDI + 0x104) == -1) {
    uVar1 = MeshEdgebreakerTraversalDecoder::BitstreamVersion
                      ((MeshEdgebreakerTraversalDecoder *)0x168e13);
    if (uVar1 < 0x202) {
      uVar3 = MeshEdgebreakerTraversalDecoder::DecodeSymbol
                        ((MeshEdgebreakerTraversalDecoder *)
                         CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
      *(uint32_t *)(in_RDI + 0x100) = uVar3;
    }
    else {
      *(undefined4 *)(in_RDI + 0x100) = 7;
    }
  }
  else {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x128),
                        (long)*(int *)(in_RDI + 0x104));
    iVar2 = *pvVar4 + -1;
    *pvVar4 = iVar2;
    if (iVar2 < 0) {
      return 9;
    }
    this_00 = std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            *)(in_RDI + 0x110),(long)*(int *)(in_RDI + 0x104));
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (this_00,(long)iVar2);
    if (4 < *pvVar5) {
      return 9;
    }
    *(undefined4 *)(in_RDI + 0x100) =
         *(undefined4 *)(edge_breaker_symbol_to_topology_id + (ulong)*pvVar5 * 4);
  }
  return *(uint32_t *)(in_RDI + 0x100);
}

Assistant:

inline uint32_t DecodeSymbol() {
    // First check if we have a valid context.
    if (active_context_ != -1) {
      const int context_counter = --context_counters_[active_context_];
      if (context_counter < 0) {
        return TOPOLOGY_INVALID;
      }
      const uint32_t symbol_id =
          context_symbols_[active_context_][context_counter];
      if (symbol_id > 4) {
        return TOPOLOGY_INVALID;
      }
      last_symbol_ = edge_breaker_symbol_to_topology_id[symbol_id];
    } else {
#ifdef DRACO_BACKWARDS_COMPATIBILITY_SUPPORTED
      if (BitstreamVersion() < DRACO_BITSTREAM_VERSION(2, 2)) {
        // We don't have a predicted symbol or the symbol was mis-predicted.
        // Decode it directly.
        last_symbol_ = MeshEdgebreakerTraversalDecoder::DecodeSymbol();

      } else
#endif
      {
        // The first symbol must be E.
        last_symbol_ = TOPOLOGY_E;
      }
    }
    return last_symbol_;
  }